

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O0

char * SndEmu_GetDevName(UINT8 deviceID,UINT8 opts,DEV_GEN_CFG *devCfg)

{
  UINT8 UVar1;
  AY8910_CFG *ayCfg;
  SN76496_CFG *snCfg;
  DEV_GEN_CFG *devCfg_local;
  UINT8 opts_local;
  char *pcStack_10;
  UINT8 deviceID_local;
  
  snCfg = (SN76496_CFG *)devCfg;
  if ((opts & 1) == 0) {
    snCfg = (SN76496_CFG *)0x0;
  }
  switch(deviceID) {
  case '\0':
    if (snCfg != (SN76496_CFG *)0x0) {
      if ((snCfg->_genCfg).flags != '\0') {
        pcStack_10 = "T6W28";
        return pcStack_10;
      }
      UVar1 = snCfg->shiftRegWidth;
      if (UVar1 == '\x0f') {
        if (snCfg->clkDiv != '\x01') {
          return "SN76489";
        }
        return "SN94624";
      }
      if (UVar1 != '\x10') {
        if (UVar1 != '\x11') {
          pcStack_10 = "SN764xx";
          return pcStack_10;
        }
        if (snCfg->clkDiv != '\x01') {
          return "SN76489A";
        }
        return "SN76494";
      }
      if (snCfg->noiseTaps == 9) {
        pcStack_10 = "SEGA PSG";
        return pcStack_10;
      }
      if (snCfg->noiseTaps == 0x22) {
        if (snCfg->ncrPSG == '\0') {
          pcStack_10 = "NCR8496";
          return pcStack_10;
        }
        if (snCfg->negate == '\0') {
          return "PSSJ-3";
        }
        return "NCR8496";
      }
    }
    pcStack_10 = "SN76496";
    break;
  case '\x01':
    if ((snCfg == (SN76496_CFG *)0x0) || ((snCfg->_genCfg).flags == '\0')) {
      pcStack_10 = "YM2413";
    }
    else {
      pcStack_10 = "VRC7";
    }
    break;
  case '\x02':
    if ((snCfg == (SN76496_CFG *)0x0) || ((snCfg->_genCfg).flags == '\0')) {
      pcStack_10 = "YM2612";
    }
    else {
      pcStack_10 = "YM3438";
    }
    break;
  case '\x03':
    pcStack_10 = "YM2151";
    break;
  case '\x04':
    if ((opts & 1) == 0) {
      pcStack_10 = "SegaPCM";
    }
    else {
      pcStack_10 = "Sega PCM";
    }
    break;
  case '\x05':
    if (snCfg != (SN76496_CFG *)0x0) {
      if ((snCfg->_genCfg).flags == '\x01') {
        pcStack_10 = "RF5C164";
        return pcStack_10;
      }
      if ((snCfg->_genCfg).flags == '\x02') {
        pcStack_10 = "RF5C105";
        return pcStack_10;
      }
    }
    pcStack_10 = "RF5C68";
    break;
  case '\x06':
    pcStack_10 = "YM2203";
    break;
  case '\a':
    pcStack_10 = "YM2608";
    break;
  case '\b':
    if ((snCfg == (SN76496_CFG *)0x0) || ((snCfg->_genCfg).flags == '\0')) {
      pcStack_10 = "YM2610";
    }
    else {
      pcStack_10 = "YM2610B";
    }
    break;
  case '\t':
    pcStack_10 = "YM3812";
    break;
  case '\n':
    pcStack_10 = "YM3526";
    break;
  case '\v':
    pcStack_10 = "Y8950";
    break;
  case '\f':
    pcStack_10 = "YMF262";
    break;
  case '\r':
    pcStack_10 = "YMF278B";
    break;
  case '\x0e':
    pcStack_10 = "YMF271";
    break;
  case '\x0f':
    pcStack_10 = "YMZ280B";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case '\x11':
    pcStack_10 = "32X PWM";
    break;
  case '\x12':
    if (snCfg == (SN76496_CFG *)0x0) {
LAB_00139fe2:
      pcStack_10 = "AY8910";
    }
    else {
      switch((char)snCfg->noiseTaps) {
      case '\0':
        pcStack_10 = "AY-3-8910";
        break;
      case '\x01':
        pcStack_10 = "AY-3-8912";
        break;
      case '\x02':
        pcStack_10 = "AY-3-8913";
        break;
      case '\x03':
        pcStack_10 = "AY8930";
        break;
      case '\x04':
        pcStack_10 = "AY-3-8914";
        break;
      default:
        goto LAB_00139fe2;
      case '\x10':
        pcStack_10 = "YM2149";
        break;
      case '\x11':
        pcStack_10 = "YM3439";
        break;
      case '\x12':
        pcStack_10 = "YMZ284";
        break;
      case '\x13':
        pcStack_10 = "YMZ294";
      }
    }
    break;
  case '\x13':
    if ((opts & 1) == 0) {
      pcStack_10 = "GB DMG";
    }
    else {
      pcStack_10 = "GameBoy DMG";
    }
    break;
  case '\x14':
    if ((snCfg == (SN76496_CFG *)0x0) || ((snCfg->_genCfg).flags == '\0')) {
      pcStack_10 = "NES APU";
    }
    else {
      pcStack_10 = "NES APU + FDS";
    }
    break;
  case '\x15':
    pcStack_10 = "YMW258";
    break;
  case '\x16':
    pcStack_10 = "uPD7759";
    break;
  case '\x17':
    pcStack_10 = "OKIM6258";
    break;
  case '\x18':
    pcStack_10 = "OKIM6295";
    break;
  case '\x19':
    if ((snCfg == (SN76496_CFG *)0x0) || ((snCfg->_genCfg).flags == '\0')) {
      pcStack_10 = "K051649";
    }
    else {
      pcStack_10 = "K052539";
    }
    break;
  case '\x1a':
    pcStack_10 = "K054539";
    break;
  case '\x1b':
    pcStack_10 = "C6280";
    break;
  case '\x1c':
    pcStack_10 = "C140";
    break;
  case '\x1d':
    pcStack_10 = "K053260";
    break;
  case '\x1e':
    pcStack_10 = "Pokey";
    break;
  case '\x1f':
    pcStack_10 = "QSound";
    break;
  case ' ':
    pcStack_10 = "SCSP";
    break;
  case '!':
    if ((opts & 1) == 0) {
      pcStack_10 = "WSwan";
    }
    else {
      pcStack_10 = "WonderSwan";
    }
    break;
  case '\"':
    pcStack_10 = "VBoy VSU";
    break;
  case '#':
    pcStack_10 = "SAA1099";
    break;
  case '$':
    pcStack_10 = "ES5503";
    break;
  case '%':
    if ((snCfg == (SN76496_CFG *)0x0) || ((snCfg->_genCfg).flags != '\0')) {
      pcStack_10 = "ES5506";
    }
    else {
      pcStack_10 = "ES5505";
    }
    break;
  case '&':
    pcStack_10 = "X1-010";
    break;
  case '\'':
    pcStack_10 = "C352";
    break;
  case '(':
    pcStack_10 = "GA20";
    break;
  case ')':
    pcStack_10 = "MIKEY";
    break;
  case 0x80:
    pcStack_10 = "C219";
  }
  return pcStack_10;
}

Assistant:

const char* SndEmu_GetDevName(UINT8 deviceID, UINT8 opts, const DEV_GEN_CFG* devCfg)
{
	if (! (opts & 0x01))
		devCfg = NULL;	// devCfg only has an effect when "long names" are enabled
	switch(deviceID)
	{
#ifdef SNDDEV_SN76496
	case DEVID_SN76496:
		if (devCfg != NULL)
		{
			const SN76496_CFG* snCfg = (const SN76496_CFG*)devCfg;
			if (snCfg->_genCfg.flags)
				return "T6W28";
			switch(snCfg->shiftRegWidth)
			{
			case 0x0F:
				return (snCfg->clkDiv == 1) ? "SN94624" : "SN76489";
			case 0x10:
				if (snCfg->noiseTaps == 0x0009)
					return "SEGA PSG";
				else if (snCfg->noiseTaps == 0x0022)
				{
					if (snCfg->ncrPSG)	// Tandy noise mode
						return snCfg->negate ? "NCR8496" : "PSSJ-3";
					else
						return "NCR8496";
				}
				break;
			case 0x11:
				return (snCfg->clkDiv == 1) ? "SN76494" : "SN76489A";
			default:
				return "SN764xx";
			}
		}
		return "SN76496";
#endif
#ifdef SNDDEV_YM2413
	case DEVID_YM2413:
		if (devCfg != NULL && devCfg->flags)
			return "VRC7";
		return "YM2413";
#endif
#ifdef SNDDEV_YM2612
	case DEVID_YM2612:
		if (devCfg != NULL && devCfg->flags)
			return "YM3438";
		return "YM2612";
#endif
#ifdef SNDDEV_YM2151
	case DEVID_YM2151:
		return "YM2151";
#endif
#ifdef SNDDEV_SEGAPCM
	case DEVID_SEGAPCM:
		if (opts & 0x01)
			return "Sega PCM";
		return "SegaPCM";
#endif
#ifdef SNDDEV_RF5C68
	case DEVID_RF5C68:
		if (devCfg != NULL)
		{
			if (devCfg->flags == 1)
				return "RF5C164";
			else if (devCfg->flags == 2)
				return "RF5C105";
		}
		return "RF5C68";
#endif
#ifdef SNDDEV_YM2203
	case DEVID_YM2203:
		return "YM2203";
#endif
#ifdef SNDDEV_YM2608
	case DEVID_YM2608:
		return "YM2608";
#endif
#ifdef SNDDEV_YM2610
	case DEVID_YM2610:
		if (devCfg != NULL && devCfg->flags)
			return "YM2610B";
		return "YM2610";
#endif
#ifdef SNDDEV_YM3812
	case DEVID_YM3812:
		return "YM3812";
#endif
#ifdef SNDDEV_YM3526
	case DEVID_YM3526:
		return "YM3526";
#endif
#ifdef SNDDEV_Y8950
	case DEVID_Y8950:
		return "Y8950";
#endif
#ifdef SNDDEV_YMF262
	case DEVID_YMF262:
		return "YMF262";
#endif
#ifdef SNDDEV_YMF278B
	case DEVID_YMF278B:
		return "YMF278B";
#endif
#ifdef SNDDEV_YMF271
	case DEVID_YMF271:
		return "YMF271";
#endif
#ifdef SNDDEV_YMZ280B
	case DEVID_YMZ280B:
		return "YMZ280B";
#endif
#ifdef SNDDEV_32X_PWM
	case DEVID_32X_PWM:
		return "32X PWM";
#endif
#ifdef SNDDEV_AY8910
	case DEVID_AY8910:
		if (devCfg != NULL)
		{
			const AY8910_CFG* ayCfg = (const AY8910_CFG*)devCfg;
			switch(ayCfg->chipType)
			{
			case 0x00:
				return "AY-3-8910";
			case 0x01:
				return "AY-3-8912";
			case 0x02:
				return "AY-3-8913";
			case 0x03:
				return "AY8930";
			case 0x04:
				return "AY-3-8914";
			case 0x10:
				return "YM2149";
			case 0x11:
				return "YM3439";
			case 0x12:
				return "YMZ284";
			case 0x13:
				return "YMZ294";
			}
		}
		return "AY8910";
#endif
#ifdef SNDDEV_GAMEBOY
	case DEVID_GB_DMG:
		if (opts & 0x01)
			return "GameBoy DMG";
		return "GB DMG";
#endif
#ifdef SNDDEV_NES_APU
	case DEVID_NES_APU:
		if (devCfg != NULL && devCfg->flags)
			return "NES APU + FDS";
		return "NES APU";
#endif
#ifdef SNDDEV_YMW258
	case DEVID_YMW258:
		return "YMW258";
#endif
#ifdef SNDDEV_UPD7759
	case DEVID_uPD7759:
		return "uPD7759";
#endif
#ifdef SNDDEV_OKIM6258
	case DEVID_OKIM6258:
		return "OKIM6258";
#endif
#ifdef SNDDEV_OKIM6295
	case DEVID_OKIM6295:
		return "OKIM6295";
#endif
#ifdef SNDDEV_K051649
	case DEVID_K051649:
		if (devCfg != NULL && devCfg->flags)
			return "K052539";
		return "K051649";
#endif
#ifdef SNDDEV_K054539
	case DEVID_K054539:
		return "K054539";
#endif
#ifdef SNDDEV_C6280
	case DEVID_C6280:
		return "C6280";
#endif
#ifdef SNDDEV_C140
	case DEVID_C140:
		return "C140";
#endif
#ifdef SNDDEV_C219
	case DEVID_C219:
		return "C219";
#endif
#ifdef SNDDEV_K053260
	case DEVID_K053260:
		return "K053260";
#endif
#ifdef SNDDEV_POKEY
	case DEVID_POKEY:
		return "Pokey";
#endif
#ifdef SNDDEV_QSOUND
	case DEVID_QSOUND:
		return "QSound";
#endif
#ifdef SNDDEV_SCSP
	case DEVID_SCSP:
		return "SCSP";
#endif
#ifdef SNDDEV_WSWAN
	case DEVID_WSWAN:
		if (opts & 0x01)
			return "WonderSwan";
		return "WSwan";
#endif
#ifdef SNDDEV_VBOY_VSU
	case DEVID_VBOY_VSU:
		return "VBoy VSU";
#endif
#ifdef SNDDEV_SAA1099
	case DEVID_SAA1099:
		return "SAA1099";
#endif
#ifdef SNDDEV_ES5503
	case DEVID_ES5503:
		return "ES5503";
#endif
#ifdef SNDDEV_ES5506
	case DEVID_ES5506:
		if (devCfg != NULL && ! devCfg->flags)
			return "ES5505";
		return "ES5506";
#endif
#ifdef SNDDEV_X1_010
	case DEVID_X1_010:
		return "X1-010";
#endif
#ifdef SNDDEV_C352
	case DEVID_C352:
		return "C352";
#endif
#ifdef SNDDEV_GA20
	case DEVID_GA20:
		return "GA20";
#endif
#ifdef SNDDEV_MIKEY
	case DEVID_MIKEY:
		return "MIKEY";
#endif
	default:
		return NULL;
	}
}